

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

void MD5Final(uchar *digest,MD5_CTX *ctx)

{
  uint uVar1;
  long lVar2;
  uint8_t count [8];
  ulong local_20;
  
  local_20 = ctx->count;
  uVar1 = (uint)(local_20 >> 3) & 0x3f;
  MD5Update(ctx,PADDING,((ulong)(0x37 < uVar1) * 0x40 - (ulong)uVar1) + 0x38);
  MD5Update(ctx,&local_20,8);
  lVar2 = 0;
  do {
    digest[lVar2 * 4 + 3] = *(uchar *)((long)ctx->state + lVar2 * 4 + 3);
    digest[lVar2 * 4 + 2] = *(uchar *)((long)ctx->state + lVar2 * 4 + 2);
    digest[lVar2 * 4 + 1] = *(uchar *)((long)ctx->state + lVar2 * 4 + 1);
    digest[lVar2 * 4] = (uchar)ctx->state[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  ctx->buffer[0x28] = '\0';
  ctx->buffer[0x29] = '\0';
  ctx->buffer[0x2a] = '\0';
  ctx->buffer[0x2b] = '\0';
  ctx->buffer[0x2c] = '\0';
  ctx->buffer[0x2d] = '\0';
  ctx->buffer[0x2e] = '\0';
  ctx->buffer[0x2f] = '\0';
  ctx->buffer[0x30] = '\0';
  ctx->buffer[0x31] = '\0';
  ctx->buffer[0x32] = '\0';
  ctx->buffer[0x33] = '\0';
  ctx->buffer[0x34] = '\0';
  ctx->buffer[0x35] = '\0';
  ctx->buffer[0x36] = '\0';
  ctx->buffer[0x37] = '\0';
  ctx->buffer[0x18] = '\0';
  ctx->buffer[0x19] = '\0';
  ctx->buffer[0x1a] = '\0';
  ctx->buffer[0x1b] = '\0';
  ctx->buffer[0x1c] = '\0';
  ctx->buffer[0x1d] = '\0';
  ctx->buffer[0x1e] = '\0';
  ctx->buffer[0x1f] = '\0';
  ctx->buffer[0x20] = '\0';
  ctx->buffer[0x21] = '\0';
  ctx->buffer[0x22] = '\0';
  ctx->buffer[0x23] = '\0';
  ctx->buffer[0x24] = '\0';
  ctx->buffer[0x25] = '\0';
  ctx->buffer[0x26] = '\0';
  ctx->buffer[0x27] = '\0';
  ctx->buffer[8] = '\0';
  ctx->buffer[9] = '\0';
  ctx->buffer[10] = '\0';
  ctx->buffer[0xb] = '\0';
  ctx->buffer[0xc] = '\0';
  ctx->buffer[0xd] = '\0';
  ctx->buffer[0xe] = '\0';
  ctx->buffer[0xf] = '\0';
  ctx->buffer[0x10] = '\0';
  ctx->buffer[0x11] = '\0';
  ctx->buffer[0x12] = '\0';
  ctx->buffer[0x13] = '\0';
  ctx->buffer[0x14] = '\0';
  ctx->buffer[0x15] = '\0';
  ctx->buffer[0x16] = '\0';
  ctx->buffer[0x17] = '\0';
  ctx->count = 0;
  ctx->buffer[0] = '\0';
  ctx->buffer[1] = '\0';
  ctx->buffer[2] = '\0';
  ctx->buffer[3] = '\0';
  ctx->buffer[4] = '\0';
  ctx->buffer[5] = '\0';
  ctx->buffer[6] = '\0';
  ctx->buffer[7] = '\0';
  ctx->state[0] = 0;
  ctx->state[1] = 0;
  ctx->state[2] = 0;
  ctx->state[3] = 0;
  ctx->buffer[0x38] = '\0';
  ctx->buffer[0x39] = '\0';
  ctx->buffer[0x3a] = '\0';
  ctx->buffer[0x3b] = '\0';
  ctx->buffer[0x3c] = '\0';
  ctx->buffer[0x3d] = '\0';
  ctx->buffer[0x3e] = '\0';
  ctx->buffer[0x3f] = '\0';
  return;
}

Assistant:

void MD5Final(unsigned char digest[MD5_DIGEST_LENGTH], MD5_CTX *ctx)
{
	uint8_t count[8];
	size_t padlen;
	int i;

	/* Convert count to 8 bytes in little endian order. */
	PUT_64BIT_LE(count, ctx->count);

	/* Pad out to 56 mod 64. */
	padlen =
		MD5_BLOCK_LENGTH - ((ctx->count >> 3) & (MD5_BLOCK_LENGTH - 1));
	if (padlen < 1 + 8)
		padlen += MD5_BLOCK_LENGTH;
	MD5Update(ctx, PADDING, padlen - 8); /* padlen - 8 <= 64 */
	MD5Update(ctx, count, 8);

	for (i = 0; i < 4; i++)
		PUT_32BIT_LE(digest + i * 4, ctx->state[i]);
	memset(ctx, 0, sizeof(*ctx)); /* in case it's sensitive */
}